

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnrealLoader.h
# Opt level: O0

void Assimp::Unreal::DecompressVertex(aiVector3D *v,int32_t in)

{
  Vertex n;
  int32_t in_local;
  aiVector3D *v_local;
  
  v->x = (float)((in << 0x15) >> 0x15);
  v->y = (float)((in << 10) >> 0x15);
  v->z = (float)(in >> 0x16);
  return;
}

Assistant:

inline void DecompressVertex(aiVector3D& v, int32_t in)
{
    union {
        Vertex n;
        int32_t i;
    };
    i = in;

    v.x = (float)n.X;
    v.y = (float)n.Y;
    v.z = (float)n.Z;
}